

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

bool __thiscall
ExecutorX86::TranslateToNative(ExecutorX86 *this,bool enableLogFiles,OutputContext *output)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  CodeGenRegVmContext *pCVar5;
  uint *puVar6;
  ExternFuncInfo *pEVar7;
  byte *pbVar8;
  uchar **ppuVar9;
  x86Instruction *pxVar10;
  x86Instruction *pxVar11;
  void *pvVar12;
  RUNTIME_FUNCTION *pRVar13;
  ExpiredFunctionAddressList *pEVar14;
  uchar *puVar15;
  uint local_3ac;
  uint local_12c;
  uchar *puStack_128;
  uint i_7;
  uchar *code;
  uint k;
  ExpiredFunctionAddressList *info_1;
  uint local_108;
  uint i_6;
  uint i_5;
  uint i_4;
  ExpiredCodeBlock block;
  uchar *binCodeNew;
  bool local_d5;
  uint oldBinCodeReserved;
  bool codeRelocated;
  RegVmCmd RStack_d0;
  uint local_c4;
  uint local_c0;
  uint dataId;
  uint count_1;
  int regId;
  uint count;
  uint uStack_ac;
  bool isRaxCleared;
  uint argumentsSize;
  uint stackSize;
  ExternFuncInfo *target_1;
  RegVmCmd *pRStack_98;
  uint currSize;
  RegVmCmd *cmd;
  uint local_88;
  uint pos;
  uint activeGlobalCodeStart;
  uint i_3;
  ExpiredFunctionAddressList info;
  uint counts;
  uint e_2;
  uint i_2;
  ExternFuncInfo *target;
  uint local_50;
  uint e_1;
  uint i_1;
  uint e;
  uint i;
  TraceScope traceScope;
  OutputContext *output_local;
  bool enableLogFiles_local;
  ExecutorX86 *this_local;
  
  if ((TranslateToNative(bool,OutputContext&)::token == '\0') &&
     (iVar1 = __cxa_guard_acquire(&TranslateToNative(bool,OutputContext&)::token), iVar1 != 0)) {
    TranslateToNative::token = NULLC::TraceGetToken("x86","TranslateToNative");
    __cxa_guard_release(&TranslateToNative(bool,OutputContext&)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&i,TranslateToNative::token);
  uVar2 = FastVector<x86Instruction,_true,_true>::size(&this->instList);
  if (uVar2 != 0) {
    pxVar10 = (this->instList).data;
    uVar2 = FastVector<x86Instruction,_true,_true>::size(&this->instList);
    NULLC::fillMemory(pxVar10,0,(ulong)uVar2 * 0x50);
  }
  FastVector<x86Instruction,_true,_true>::clear(&this->instList);
  FastVector<x86Instruction,_true,_true>::reserve(&this->instList,0x40);
  if (this->codeGenCtx == (CodeGenRegVmContext *)0x0) {
    pCVar5 = NULLC::construct<CodeGenRegVmContext>();
    this->codeGenCtx = pCVar5;
  }
  this->codeGenCtx->x86rvm = this;
  this->codeGenCtx->exFunctions = this->exFunctions->data;
  this->codeGenCtx->exTypes = this->exTypes->data;
  this->codeGenCtx->exTypeExtra = (this->exLinker->exTypeExtra).data;
  this->codeGenCtx->exLocals = (this->exLinker->exLocals).data;
  this->codeGenCtx->exRegVmConstants = this->exRegVmConstants->data;
  this->codeGenCtx->exRegVmConstantsEnd =
       this->exRegVmConstants->data + this->exRegVmConstants->count;
  this->codeGenCtx->exRegVmRegKillInfo = this->exRegVmRegKillInfo->data;
  this->codeGenCtx->exSymbols = (this->exLinker->exSymbols).data;
  this->codeGenCtx->vmState = &this->vmState;
  (this->vmState).ctx = this->codeGenCtx;
  (this->vmState).exRegVmConstants = this->exRegVmConstants->data;
  pxVar10 = (this->instList).data;
  CodeGenGenericContext::SetLastInstruction(&this->codeGenCtx->ctx,pxVar10,pxVar10);
  CommonSetLinker(this->exLinker);
  EMIT_OP(&this->codeGenCtx->ctx,o_use32);
  uVar2 = FastVector<RegVmCmd,_false,_false>::size(this->exRegVmCode);
  FastVector<unsigned_int,_false,_false>::resize(&this->codeJumpTargets,uVar2);
  uVar2 = FastVector<unsigned_int,_false,_false>::size(&this->codeJumpTargets);
  if (uVar2 != 0) {
    puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                       (&this->codeJumpTargets,this->lastInstructionCount);
    uVar2 = FastVector<unsigned_int,_false,_false>::size(&this->codeJumpTargets);
    NULLC::fillMemory(puVar6,0,(ulong)(uVar2 - this->lastInstructionCount) << 2);
  }
  e = 0;
  FastVector<unsigned_int,_false,_false>::push_back(&this->codeJumpTargets,&e);
  i_1 = this->oldJumpTargetCount;
  uVar2 = FastVector<unsigned_int,_false,_false>::size(&this->exLinker->regVmJumpTargets);
  for (; i_1 != uVar2; i_1 = i_1 + 1) {
    puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                       (&this->exLinker->regVmJumpTargets,i_1);
    puVar6 = FastVector<unsigned_int,_false,_false>::operator[](&this->codeJumpTargets,*puVar6);
    *puVar6 = 1;
  }
  local_50 = 0;
  uVar2 = FastVector<ExternFuncInfo,_false,_false>::size(&this->exLinker->exFunctions);
  for (; local_50 != uVar2; local_50 = local_50 + 1) {
    pEVar7 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                       (&this->exLinker->exFunctions,local_50);
    if (((pEVar7->regVmAddress != -1) && (pEVar7->regVmCodeSize != 0)) &&
       (puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                           (&this->codeJumpTargets,pEVar7->regVmAddress), *puVar6 >> 8 == 0)) {
      puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                         (&this->codeJumpTargets,pEVar7->regVmAddress);
      *puVar6 = local_50 << 8 | 2 | *puVar6;
    }
  }
  uVar2 = FastVector<RegVmCmd,_false,_false>::size(this->exRegVmCode);
  FastVector<unsigned_int,_false,_false>::resize(&this->codeRegKillInfoOffsets,uVar2);
  counts = this->lastInstructionCount;
  uVar2 = FastVector<RegVmCmd,_false,_false>::size(this->exRegVmCode);
  for (; counts != uVar2; counts = counts + 1) {
    uVar3 = this->oldRegKillInfoCount;
    puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                       (&this->codeRegKillInfoOffsets,counts);
    *puVar6 = uVar3;
    pbVar8 = FastVector<unsigned_char,_false,_false>::operator[]
                       (this->exRegVmRegKillInfo,this->oldRegKillInfoCount);
    info._12_4_ = ZEXT14(*pbVar8);
    this->oldRegKillInfoCount = (*pbVar8 >> 4) + 1 + (info._12_4_ & 0xf) + this->oldRegKillInfoCount
    ;
  }
  uVar2 = this->oldRegKillInfoCount;
  uVar3 = FastVector<unsigned_char,_false,_false>::size(this->exRegVmRegKillInfo);
  if (uVar2 != uVar3) {
    __assert_fail("oldRegKillInfoCount == exRegVmRegKillInfo.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                  ,0x53c,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
  }
  if (((this->codeRunning & 1U) == 0) ||
     (uVar2 = FastVector<ExternFuncInfo,_false,_false>::size(this->exFunctions),
     uVar2 < (this->functionAddress).max)) {
    uVar2 = FastVector<ExternFuncInfo,_false,_false>::size(this->exFunctions);
    FastVector<unsigned_char_*,_false,_false>::resize(&this->functionAddress,uVar2);
  }
  else {
    _activeGlobalCodeStart = (this->functionAddress).data;
    info.data._0_4_ = (this->functionAddress).count;
    FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::push_back
              (&this->expiredFunctionAddressLists,
               (ExpiredFunctionAddressList *)&activeGlobalCodeStart);
    (this->functionAddress).data = (uchar **)0x0;
    (this->functionAddress).count = 0;
    (this->functionAddress).max = 0;
    uVar2 = FastVector<ExternFuncInfo,_false,_false>::size(this->exFunctions);
    FastVector<unsigned_char_*,_false,_false>::resize(&this->functionAddress,uVar2);
    for (pos = 0; pos < this->oldFunctionSize; pos = pos + 1) {
      pEVar7 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,pos);
      if (pEVar7->regVmAddress == -1) {
        ppuVar9 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->functionAddress,pos);
        *ppuVar9 = (uchar *)0x0;
      }
      else {
        pEVar7 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,pos);
        ppuVar9 = FastVector<unsigned_char_*,_false,_false>::operator[]
                            (&this->instAddress,pEVar7->regVmAddress);
        puVar15 = *ppuVar9;
        ppuVar9 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->functionAddress,pos);
        *ppuVar9 = puVar15;
      }
    }
  }
  (this->vmState).functionAddress = (this->functionAddress).data;
  SetOptimizationLookBehind(&this->codeGenCtx->ctx,false);
  local_88 = 0;
  cmd._4_4_ = this->lastInstructionCount;
  while (uVar2 = cmd._4_4_, uVar3 = FastVector<RegVmCmd,_false,_false>::size(this->exRegVmCode),
        uVar2 < uVar3) {
    pRStack_98 = FastVector<RegVmCmd,_false,_false>::operator[](this->exRegVmCode,cmd._4_4_);
    pxVar10 = CodeGenGenericContext::GetLastInstruction(&this->codeGenCtx->ctx);
    target_1._4_4_ = (uint)(((long)pxVar10 - (long)(this->instList).data) / 0x50);
    (this->instList).count = target_1._4_4_;
    if ((this->instList).max <= target_1._4_4_ + 0x40) {
      FastVector<x86Instruction,_true,_true>::grow(&this->instList,target_1._4_4_ + 0x40);
    }
    pxVar10 = (this->instList).data;
    CodeGenGenericContext::SetLastInstruction
              (&this->codeGenCtx->ctx,pxVar10 + target_1._4_4_,pxVar10);
    uVar2 = cmd._4_4_ + 1;
    pxVar10 = CodeGenGenericContext::GetLastInstruction(&this->codeGenCtx->ctx);
    pxVar10->instID = uVar2;
    puVar6 = FastVector<unsigned_int,_false,_false>::operator[](&this->codeJumpTargets,cmd._4_4_);
    if (*puVar6 != 0) {
      SetOptimizationLookBehind(&this->codeGenCtx->ctx,false);
    }
    this->codeGenCtx->currInstructionPos = cmd._4_4_;
    puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                       (&this->codeRegKillInfoOffsets,cmd._4_4_);
    this->codeGenCtx->currInstructionRegKillOffset = *puVar6;
    puVar6 = FastVector<unsigned_int,_false,_false>::operator[](&this->codeJumpTargets,cmd._4_4_);
    if ((*puVar6 & 6) != 0) {
      puVar6 = FastVector<unsigned_int,_false,_false>::operator[](&this->codeJumpTargets,cmd._4_4_);
      if ((*puVar6 & 4) != 0) {
        local_88 = cmd._4_4_;
        this->codeGenCtx->currFunctionId = 0;
      }
      EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,0);
      EMIT_OP_REG(&this->codeGenCtx->ctx,o_push,rEBX);
      EMIT_OP_REG(&this->codeGenCtx->ctx,o_push,rR15);
      EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_sub64,rESP,0x28);
      EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,1);
      puVar6 = FastVector<unsigned_int,_false,_false>::operator[](&this->codeJumpTargets,cmd._4_4_);
      if ((*puVar6 & 2) != 0) {
        puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                           (&this->codeJumpTargets,cmd._4_4_);
        this->codeGenCtx->currFunctionId = *puVar6 >> 8;
        _argumentsSize =
             FastVector<ExternFuncInfo,_false,_false>::operator[]
                       (&this->exLinker->exFunctions,this->codeGenCtx->currFunctionId);
        uStack_ac = _argumentsSize->stackSize + 0xf & 0xfffffff0;
        count = _argumentsSize->argumentSize;
        EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,0);
        EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_mov64,rEBX,sQWORD,rR13,0x140);
        EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_mov64,rR15,sQWORD,rR13,0x108);
        EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_mov64,rEAX,sQWORD,rR13,0x100);
        EMIT_OP_RPTR_REG(&this->codeGenCtx->ctx,o_mov64,sQWORD,rEBX,0,rEAX);
        EMIT_OP_RPTR_NUM(&this->codeGenCtx->ctx,o_add64,sQWORD,rR13,0x108,uStack_ac);
        EMIT_OP_RPTR_NUM(&this->codeGenCtx->ctx,o_add64,sQWORD,rR13,0x140,
                         _argumentsSize->regVmRegisters << 3);
        EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,1);
        regId._3_1_ = 0;
        if (4 < _argumentsSize->regVmRegisters) {
          count_1 = _argumentsSize->regVmRegisters - 4;
          if (count_1 < 9) {
            for (dataId = 4; (int)dataId < _argumentsSize->regVmRegisters; dataId = dataId + 1) {
              EMIT_OP_RPTR_NUM(&this->codeGenCtx->ctx,o_mov64,sQWORD,rEBX,dataId << 3,0);
            }
          }
          else {
            regId._3_1_ = 1;
            EMIT_OP_REG_REG(&this->codeGenCtx->ctx,o_xor,rEAX,rEAX);
            EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_lea,rEDI,sQWORD,rEBX,0x20);
            EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_mov,rECX,count_1);
            EMIT_OP(&this->codeGenCtx->ctx,o_rep_stosq);
          }
        }
        local_c0 = uStack_ac - count;
        if (local_c0 != 0) {
          if ((local_c0 & 3) != 0) {
            __assert_fail("count % 4 == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                          ,0x5c3,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
          }
          if (local_c0 < 0x11) {
            for (local_c4 = 0; local_c4 < local_c0 >> 2; local_c4 = local_c4 + 1) {
              EMIT_OP_RPTR_NUM(&this->codeGenCtx->ctx,o_mov,sDWORD,rR15,count + local_c4 * 4,0);
            }
          }
          else {
            if ((regId._3_1_ & 1) == 0) {
              EMIT_OP_REG_REG(&this->codeGenCtx->ctx,o_xor,rEAX,rEAX);
            }
            EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_lea,rEDI,sQWORD,rR15,count);
            EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_mov,rECX,local_c0 >> 2);
            EMIT_OP(&this->codeGenCtx->ctx,o_rep_stosd);
          }
        }
      }
    }
    if ((pRStack_98->code == '\x1d') && (pRStack_98->rA != '\0')) {
      puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                         (&this->codeJumpTargets,pRStack_98->argument);
      *puVar6 = *puVar6 | 4;
      if (local_88 != 0) {
        FastVector<unsigned_int,_false,_false>::push_back
                  (&this->globalCodeRanges,(uint *)((long)&cmd + 4));
      }
      FastVector<unsigned_int,_false,_false>::push_back
                (&this->globalCodeRanges,&pRStack_98->argument);
      if (cmd._4_4_ != 0) {
        EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_add64,rESP,0x28);
        EMIT_OP_REG(&this->codeGenCtx->ctx,o_pop,rR15);
        EMIT_OP_REG(&this->codeGenCtx->ctx,o_pop,rEBX);
      }
    }
    cmd._4_4_ = cmd._4_4_ + 1;
    RStack_d0 = *pRStack_98;
    (**(code **)(NULLC::cgFuncs + (ulong)pRStack_98->code * 8))(this->codeGenCtx,RStack_d0);
    CodeGenGenericContext::KillLateUnreadRegVmRegisters
              (&this->codeGenCtx->ctx,
               this->exRegVmRegKillInfo->data + this->codeGenCtx->currInstructionRegKillOffset);
    CodeGenGenericContext::UnlockRegisters(&this->codeGenCtx->ctx);
    SetOptimizationLookBehind(&this->codeGenCtx->ctx,true);
  }
  FastVector<unsigned_int,_false,_false>::push_back
            (&this->globalCodeRanges,(uint *)((long)&cmd + 4));
  uVar2 = cmd._4_4_ + 1;
  pxVar10 = CodeGenGenericContext::GetLastInstruction(&this->codeGenCtx->ctx);
  pxVar10->instID = uVar2;
  uVar2 = FastVector<RegVmCmd,_false,_false>::size(this->exRegVmCode);
  puVar6 = FastVector<unsigned_int,_false,_false>::operator[](&this->codeJumpTargets,uVar2);
  if ((*puVar6 & 6) != 0) {
    EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,0);
    EMIT_OP_REG(&this->codeGenCtx->ctx,o_push,rEBX);
    EMIT_OP_REG(&this->codeGenCtx->ctx,o_push,rR15);
    EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_sub64,rESP,0x28);
    EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,1);
  }
  EMIT_OP_REG_REG(&this->codeGenCtx->ctx,o_xor,rEAX,rEAX);
  EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_add64,rESP,0x28);
  EMIT_OP_REG(&this->codeGenCtx->ctx,o_pop,rR15);
  EMIT_OP_REG(&this->codeGenCtx->ctx,o_pop,rEBX);
  EMIT_OP(&this->codeGenCtx->ctx,o_ret);
  FastVector<unsigned_int,_false,_false>::pop_back(&this->codeJumpTargets);
  pxVar10 = CodeGenGenericContext::GetLastInstruction(&this->codeGenCtx->ctx);
  pxVar11 = FastVector<x86Instruction,_true,_true>::operator[](&this->instList,0);
  FastVector<x86Instruction,_true,_true>::resize
            (&this->instList,(int)((ulong)((long)pxVar10 - (long)pxVar11) >> 4) * -0x33333333);
  oldBinCodeReserved = 0;
  FastVector<unsigned_int,_false,_false>::push_back(&this->codeJumpTargets,&oldBinCodeReserved);
  if (enableLogFiles) {
    if (output->stream != (void *)0x0) {
      __assert_fail("!output.stream",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                    ,0x669,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
    }
    pvVar12 = (*output->openStream)("asmX86.txt");
    output->stream = pvVar12;
    if (output->stream != (void *)0x0) {
      SaveListing(this,output);
      (*output->closeStream)(output->stream);
      output->stream = (void *)0x0;
    }
  }
  FastVector<unsigned_int,_false,_false>::pop_back(&this->codeJumpTargets);
  local_d5 = false;
  uVar2 = this->binCodeSize;
  uVar3 = FastVector<x86Instruction,_true,_true>::size(&this->instList);
  if (this->binCodeReserved < uVar2 + uVar3 * 8) {
    uVar2 = this->binCodeReserved;
    uVar3 = this->binCodeSize;
    uVar4 = FastVector<x86Instruction,_true,_true>::size(&this->instList);
    this->binCodeReserved = uVar3 + 0x1000 + uVar4 * 8;
    block.unwindTable = (RUNTIME_FUNCTION *)(*(code *)NULLC::alloc)(this->binCodeReserved);
    if ((this->binCode != (uchar *)0x0) && ((this->codeRunning & 1U) == 0)) {
      NULLC::MemProtect(this->binCode,uVar2,3);
    }
    NULLC::MemProtect(block.unwindTable,this->binCodeReserved,7);
    if (this->binCodeSize != 0) {
      NULLC::copyMemory(block.unwindTable,this->binCode,(ulong)this->binCodeSize);
    }
    local_d5 = (this->codeRunning & 1U) == 0;
    if (local_d5) {
      (*(code *)NULLC::dealloc)(this->binCode);
    }
    else {
      _i_5 = this->binCode;
      block._8_8_ = (this->functionWin64UnwindTable).data;
      (this->functionWin64UnwindTable).data = (_RUNTIME_FUNCTION *)0x0;
      (this->functionWin64UnwindTable).count = 0;
      (this->functionWin64UnwindTable).max = 0;
      block.code._0_4_ = uVar2;
      FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::push_back
                (&this->expiredCodeBlocks,(ExpiredCodeBlock *)&i_5);
    }
    local_d5 = !local_d5;
    for (i_6 = 0; uVar2 = FastVector<unsigned_char_*,_false,_false>::size(&this->instAddress),
        i_6 < uVar2; i_6 = i_6 + 1) {
      ppuVar9 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->instAddress,i_6);
      pRVar13 = block.unwindTable + ((long)*ppuVar9 - (long)this->binCode);
      ppuVar9 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->instAddress,i_6);
      *ppuVar9 = (uchar *)pRVar13;
    }
    for (local_108 = 0;
        uVar2 = FastVector<unsigned_char_*,_false,_false>::size(&this->functionAddress),
        local_108 < uVar2; local_108 = local_108 + 1) {
      ppuVar9 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (&this->functionAddress,local_108);
      if (*ppuVar9 != (uchar *)0x0) {
        ppuVar9 = FastVector<unsigned_char_*,_false,_false>::operator[]
                            (&this->functionAddress,local_108);
        pRVar13 = block.unwindTable + ((long)*ppuVar9 - (long)this->binCode);
        ppuVar9 = FastVector<unsigned_char_*,_false,_false>::operator[]
                            (&this->functionAddress,local_108);
        *ppuVar9 = (uchar *)pRVar13;
      }
    }
    for (info_1._4_4_ = 0;
        uVar2 = FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::size
                          (&this->expiredFunctionAddressLists), info_1._4_4_ < uVar2;
        info_1._4_4_ = info_1._4_4_ + 1) {
      pEVar14 = FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::operator[]
                          (&this->expiredFunctionAddressLists,info_1._4_4_);
      for (code._4_4_ = 0; code._4_4_ < pEVar14->count; code._4_4_ = code._4_4_ + 1) {
        if (pEVar14->data[code._4_4_] != (uchar *)0x0) {
          pEVar14->data[code._4_4_] =
               (uchar *)(block.unwindTable + ((long)pEVar14->data[code._4_4_] - (long)this->binCode)
                        );
        }
      }
    }
    this->binCode = (uchar *)block.unwindTable;
  }
  puStack_128 = this->binCode + this->binCodeSize;
  if (this->binCodeSize != 0) {
    puStack_128 = puStack_128 + -10;
  }
  uVar2 = FastVector<RegVmCmd,_false,_false>::size(this->exRegVmCode);
  FastVector<unsigned_char_*,_false,_false>::resize(&this->instAddress,uVar2 + 1);
  ppuVar9 = (this->instAddress).data;
  uVar2 = this->lastInstructionCount;
  uVar3 = FastVector<RegVmCmd,_false,_false>::size(this->exRegVmCode);
  NULLC::fillMemory(ppuVar9 + uVar2,0,(ulong)((uVar3 - this->lastInstructionCount) + 1) << 3);
  (this->vmState).instAddress = (this->instAddress).data;
  x86ClearLabels();
  x86ReserveLabels(this->codeGenCtx->labelCount);
  puVar15 = this->binCode;
  uVar2 = this->binCodeReserved;
  pxVar10 = (this->instList).data;
  uVar3 = FastVector<x86Instruction,_true,_true>::size(&this->instList);
  puVar15 = x86TranslateInstructionList
                      (puStack_128,puVar15 + uVar2,pxVar10,uVar3,(this->instAddress).data);
  if (this->binCodeReserved <= this->binCodeSize) {
    __assert_fail("binCodeSize < binCodeReserved",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                  ,0x756,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
  }
  this->binCodeSize = (int)puVar15 - (int)this->binCode;
  if (this->binCodeReserved <= (uint)((int)puVar15 - (int)this->binCode)) {
    __assert_fail("unsigned(code - binCode) < binCodeReserved",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                  ,0x7af,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
  }
  x86SatisfyJumps(&this->instAddress);
  if (local_d5) {
    local_3ac = 0;
  }
  else {
    local_3ac = this->oldFunctionSize;
  }
  for (local_12c = local_3ac;
      uVar2 = FastVector<ExternFuncInfo,_false,_false>::size(this->exFunctions), local_12c < uVar2;
      local_12c = local_12c + 1) {
    pEVar7 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,local_12c);
    if (pEVar7->regVmAddress == -1) {
      ppuVar9 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (&this->functionAddress,local_12c);
      *ppuVar9 = (uchar *)0x0;
    }
    else {
      pEVar7 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,local_12c);
      ppuVar9 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (&this->instAddress,pEVar7->regVmAddress);
      puVar15 = *ppuVar9;
      ppuVar9 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (&this->functionAddress,local_12c);
      *ppuVar9 = puVar15;
    }
  }
  uVar2 = FastVector<RegVmCmd,_false,_false>::size(this->exRegVmCode);
  this->lastInstructionCount = uVar2;
  uVar2 = FastVector<unsigned_int,_false,_false>::size(&this->exLinker->regVmJumpTargets);
  this->oldJumpTargetCount = uVar2;
  uVar2 = FastVector<unsigned_char,_false,_false>::size(this->exRegVmRegKillInfo);
  this->oldRegKillInfoCount = uVar2;
  uVar2 = FastVector<ExternFuncInfo,_false,_false>::size(this->exFunctions);
  this->oldFunctionSize = uVar2;
  NULLC::TraceScope::~TraceScope((TraceScope *)&i);
  return true;
}

Assistant:

bool ExecutorX86::TranslateToNative(bool enableLogFiles, OutputContext &output)
{
	TRACE_SCOPE("x86", "TranslateToNative");

	if(instList.size())
		NULLC::fillMemory(instList.data, 0, sizeof(x86Instruction) * instList.size());
	instList.clear();
	instList.reserve(64);

	if(!codeGenCtx)
		codeGenCtx = NULLC::construct<CodeGenRegVmContext>();

	codeGenCtx->x86rvm = this;

	codeGenCtx->exFunctions = exFunctions.data;
	codeGenCtx->exTypes = exTypes.data;
	codeGenCtx->exTypeExtra = exLinker->exTypeExtra.data;
	codeGenCtx->exLocals = exLinker->exLocals.data;
	codeGenCtx->exRegVmConstants = exRegVmConstants.data;
	codeGenCtx->exRegVmConstantsEnd = exRegVmConstants.data + exRegVmConstants.count;
	codeGenCtx->exRegVmRegKillInfo = exRegVmRegKillInfo.data;
	codeGenCtx->exSymbols = exLinker->exSymbols.data;

	codeGenCtx->vmState = &vmState;

	vmState.ctx = codeGenCtx;
	vmState.exRegVmConstants = exRegVmConstants.data;

	codeGenCtx->ctx.SetLastInstruction(instList.data, instList.data);

	CommonSetLinker(exLinker);

	EMIT_OP(codeGenCtx->ctx, o_use32);

	codeJumpTargets.resize(exRegVmCode.size());
	if(codeJumpTargets.size())
		NULLC::fillMemory(&codeJumpTargets[lastInstructionCount], 0, (codeJumpTargets.size() - lastInstructionCount) * sizeof(codeJumpTargets[0]));

	// Mirror extra global return so that jump to global return can be marked (rviNop, because we will have some custom code)
	codeJumpTargets.push_back(0);
	for(unsigned i = oldJumpTargetCount, e = exLinker->regVmJumpTargets.size(); i != e; i++)
		codeJumpTargets[exLinker->regVmJumpTargets[i]] = 1;

	// Mark function locations
	for(unsigned i = 0, e = exLinker->exFunctions.size(); i != e; i++)
	{
		ExternFuncInfo &target = exLinker->exFunctions[i];

		if(target.regVmAddress != -1 && target.regVmCodeSize != 0 && (codeJumpTargets[target.regVmAddress] >> 8) == 0)
			codeJumpTargets[target.regVmAddress] |= 2 + (i << 8);
	}

	// Find instruction register kill info positions
	codeRegKillInfoOffsets.resize(exRegVmCode.size());
	for(unsigned i = lastInstructionCount, e = exRegVmCode.size(); i != e; i++)
	{
		codeRegKillInfoOffsets[i] = oldRegKillInfoCount;

		unsigned counts = exRegVmRegKillInfo[oldRegKillInfoCount];

		oldRegKillInfoCount += 1 + (counts >> 4) + (counts & 0xf);
	}
	assert(oldRegKillInfoCount == exRegVmRegKillInfo.size());

	if(codeRunning && exFunctions.size() >= functionAddress.max)
	{
		ExpiredFunctionAddressList info;

		info.data = functionAddress.data;
		info.count = functionAddress.count;

		expiredFunctionAddressLists.push_back(info);

		functionAddress.data = NULL;
		functionAddress.count = 0;
		functionAddress.max = 0;

		functionAddress.resize(exFunctions.size());

		for(unsigned int i = 0; i < oldFunctionSize; i++)
		{
			if(exFunctions[i].regVmAddress != -1)
				functionAddress[i] = instAddress[exFunctions[i].regVmAddress];
			else
				functionAddress[i] = 0;
		}
	}
	else
	{
		functionAddress.resize(exFunctions.size());
	}

	vmState.functionAddress = functionAddress.data;

	SetOptimizationLookBehind(codeGenCtx->ctx, false);

	unsigned activeGlobalCodeStart = 0;

	unsigned int pos = lastInstructionCount;
	while(pos < exRegVmCode.size())
	{
		RegVmCmd &cmd = exRegVmCode[pos];

		unsigned int currSize = (int)(codeGenCtx->ctx.GetLastInstruction() - instList.data);
		instList.count = currSize;
		if(currSize + 64 >= instList.max)
			instList.grow(currSize + 64);

		codeGenCtx->ctx.SetLastInstruction(instList.data + currSize, instList.data);

		codeGenCtx->ctx.GetLastInstruction()->instID = pos + 1;

		if(codeJumpTargets[pos])
			SetOptimizationLookBehind(codeGenCtx->ctx, false);

		codeGenCtx->currInstructionPos = pos;
		codeGenCtx->currInstructionRegKillOffset = codeRegKillInfoOffsets[pos];

		// Frame setup
		if((codeJumpTargets[pos] & 6) != 0)
		{
			if(codeJumpTargets[pos] & 4)
			{
				activeGlobalCodeStart = pos;

				codeGenCtx->currFunctionId = 0;
			}

			EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 0);

#if defined(_M_X64)
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rRBX);
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rR15);
			EMIT_OP_REG_NUM(codeGenCtx->ctx, o_sub64, rRSP, 40);
#else
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rEBP);
			EMIT_OP_REG_REG(codeGenCtx->ctx, o_mov, rEBP, rESP);
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rEBX);
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rESI);
#endif

			EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 1);

			// Generate function prologue (register cleanup, data stack advance, data stack cleanup)
			if(codeJumpTargets[pos] & 2)
			{
				codeGenCtx->currFunctionId = codeJumpTargets[pos] >> 8;

				ExternFuncInfo &target = exLinker->exFunctions[codeGenCtx->currFunctionId];

				unsigned stackSize = (target.stackSize + 0xf) & ~0xf;
				unsigned argumentsSize = target.argumentSize;

#if defined(_M_X64)
				EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 0);

				EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_mov64, rRBX, sQWORD, rR13, nullcOffsetOf(&vmState, regFileLastTop));
				EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_mov64, rR15, sQWORD, rR13, nullcOffsetOf(&vmState, dataStackTop));

				EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_mov64, rRAX, sQWORD, rR13, nullcOffsetOf(&vmState, dataStackBase));
				EMIT_OP_RPTR_REG(codeGenCtx->ctx, o_mov64, sQWORD, rRBX, 0, rRAX);

				// Advance frame top
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_add64, sQWORD, rR13, nullcOffsetOf(&vmState, dataStackTop), stackSize); // vmState->dataStackTop += stackSize;

				// Advance register top
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_add64, sQWORD, rR13, nullcOffsetOf(&vmState, regFileLastTop), target.regVmRegisters * 8); // vmState->regFileLastTop += target.regVmRegisters;

				EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 1);

				bool isRaxCleared = false;

				// Clear register values
				if (target.regVmRegisters > rvrrCount)
				{
					unsigned count = target.regVmRegisters - rvrrCount;

					if(count <= 8)
					{
						for(int regId = rvrrCount; regId < target.regVmRegisters; regId++)
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov64, sQWORD, rRBX, regId * 8, 0);
					}
					else
					{
						isRaxCleared = true;

						EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rRAX, rRAX);
						EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_lea, rRDI, sQWORD, rRBX, rvrrCount * 8);
						EMIT_OP_REG_NUM(codeGenCtx->ctx, o_mov, rECX, count);
						EMIT_OP(codeGenCtx->ctx, o_rep_stosq);
					}
				}

				// Clear data stack
				// TODO: use target.stackSize which is smaller?
				if(unsigned count = stackSize - argumentsSize)
				{
					assert(count % 4 == 0);

					if(count <= 16)
					{
						for(unsigned dataId = 0; dataId < count / 4; dataId++)
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov, sDWORD, rR15, argumentsSize + dataId * 4, 0);
					}
					else
					{
						if(!isRaxCleared)
							EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rRAX, rRAX);

						EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_lea, rRDI, sQWORD, rR15, argumentsSize);
						EMIT_OP_REG_NUM(codeGenCtx->ctx, o_mov, rECX, count / 4);
						EMIT_OP(codeGenCtx->ctx, o_rep_stosd);
					}
				}
#else
				EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 0);

				EMIT_OP_REG_ADDR(codeGenCtx->ctx, o_mov, rEBX, sDWORD, uintptr_t(&vmState.regFileLastTop));
				EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_mov, rESI, sDWORD, rNONE, 1, rEBX, rvrrFrame * 8);

				// Advance frame top
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_add, sDWORD, uintptr_t(&vmState.dataStackTop), stackSize); // vmState->dataStackTop += stackSize;

				// Advance register top
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_add, sDWORD, uintptr_t(&vmState.regFileLastTop), target.regVmRegisters * 8); // vmState->regFileLastTop += target.regVmRegisters;

				EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 1);

				bool isEaxCleared = false;

				// Clear register values
				if(target.regVmRegisters > rvrrCount)
				{
					unsigned count = target.regVmRegisters - rvrrCount;

					if(count <= 4)
					{
						for(int regId = rvrrCount; regId < target.regVmRegisters; regId++)
						{
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov, sDWORD, rEBX, regId * 8, 0);
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov, sDWORD, rEBX, regId * 8, 4);
						}
					}
					else
					{
						isEaxCleared = true;

						EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rEAX, rEAX);
						EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_lea, rEDI, sDWORD, rEBX, rvrrCount * 8);
						EMIT_OP_REG_NUM(codeGenCtx->ctx, o_mov, rECX, count * 2);
						EMIT_OP(codeGenCtx->ctx, o_rep_stosd);
					}
				}

				// Clear data stack
				// TODO: use target.stackSize which is smaller?
				if(unsigned count = stackSize - argumentsSize)
				{
					assert(count % 4 == 0);

					if(count <= 16)
					{
						for(unsigned dataId = 0; dataId < count / 4; dataId++)
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov, sDWORD, rESI, argumentsSize + dataId * 4, 0);
					}
					else
					{
						if(!isEaxCleared)
							EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rEAX, rEAX);

						EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_lea, rEDI, sDWORD, rESI, argumentsSize);
						EMIT_OP_REG_NUM(codeGenCtx->ctx, o_mov, rECX, count / 4);
						EMIT_OP(codeGenCtx->ctx, o_rep_stosd);
					}
				}
#endif
			}
		}

		if(cmd.code == rviJmp && cmd.rA)
		{
			codeJumpTargets[cmd.argument] |= 4;

			if(activeGlobalCodeStart != 0)
				globalCodeRanges.push_back(pos);

			globalCodeRanges.push_back(cmd.argument);

			if(pos)
			{
#if defined(_M_X64)
				EMIT_OP_REG_NUM(codeGenCtx->ctx, o_add64, rRSP, 40);
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rR15);
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rRBX);
#else
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rESI);
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rEBX);
				EMIT_OP_REG_REG(codeGenCtx->ctx, o_mov, rESP, rEBP);
				EMIT_REG_READ(codeGenCtx->ctx, rESP);
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rEBP);
#endif
			}
		}

		pos++;

		NULLC::cgFuncs[cmd.code](*codeGenCtx, cmd);

		codeGenCtx->ctx.KillLateUnreadRegVmRegisters(exRegVmRegKillInfo.data + codeGenCtx->currInstructionRegKillOffset);
		codeGenCtx->ctx.UnlockRegisters();

		SetOptimizationLookBehind(codeGenCtx->ctx, true);
	}

	globalCodeRanges.push_back(pos);

	// Add extra global return if there is none
	codeGenCtx->ctx.GetLastInstruction()->instID = pos + 1;

	if((codeJumpTargets[exRegVmCode.size()] & 6) != 0)
	{
		EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 0);

#if defined(_M_X64)
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rRBX);
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rR15);
		EMIT_OP_REG_NUM(codeGenCtx->ctx, o_sub64, rRSP, 40);
#else
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rEBP);
		EMIT_OP_REG_REG(codeGenCtx->ctx, o_mov, rEBP, rESP);
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rEBX);
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rESI);
#endif

		EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 1);
	}

	EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rEAX, rEAX);

#if defined(_M_X64)
	EMIT_OP_REG_NUM(codeGenCtx->ctx, o_add64, rRSP, 40);
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rR15);
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rRBX);
#else
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rESI);
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rEBX);
	EMIT_OP_REG_REG(codeGenCtx->ctx, o_mov, rESP, rEBP);
	EMIT_REG_READ(codeGenCtx->ctx, rESP);
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rEBP);
#endif

	EMIT_OP(codeGenCtx->ctx, o_ret);

	// Remove rviNop, because we don't want to generate code for it
	codeJumpTargets.pop_back();

	instList.resize((int)(codeGenCtx->ctx.GetLastInstruction() - &instList[0]));

	// Once again, mirror extra global return so that jump to global return can be marked (cmdNop, because we will have some custom code)
	codeJumpTargets.push_back(false);

	if(enableLogFiles)
	{
		assert(!output.stream);
		output.stream = output.openStream("asmX86.txt");

		if(output.stream)
		{
			SaveListing(output);

			output.closeStream(output.stream);
			output.stream = NULL;
		}
	}

#if defined(NULLC_OPTIMIZE_X86) && 0
	// Second optimization pass, just feed generated instructions again

	// Set iterator at beginning
	codeGenCtx->ctx.SetLastInstruction(instList.data, instList.data);
	SetOptimizationLookBehind(codeGenCtx->ctx, false);
	// Now regenerate instructions
	for(unsigned int i = 0; i < instList.size(); i++)
	{
		x86Instruction &inst = instList[i];

		// Skip trash
		if(inst.name == o_none)
		{
			EMIT_OP(codeGenCtx->ctx, o_none);
			continue;
		}
		// If invalidation flag is set
		if(inst.instID && codeJumpTargets[inst.instID - 1])
			SetOptimizationLookBehind(codeGenCtx->ctx, false);

		if(inst.name == o_label)
		{
			EMIT_LABEL(codeGenCtx->ctx, inst.labelID, inst.argA.num);
			SetOptimizationLookBehind(codeGenCtx->ctx, true);
			continue;
		}

		switch(inst.argA.type)
		{
		case x86Argument::argNone:
			EMIT_OP(codeGenCtx->ctx, inst.name);
			break;
		case x86Argument::argNumber:
			EMIT_OP_NUM(codeGenCtx->ctx, inst.name, inst.argA.num);
			break;
		case x86Argument::argLabel:
			EMIT_OP_LABEL(codeGenCtx->ctx, inst.name, inst.argA.labelID, inst.argB.num, inst.argB.ptrNum);
			break;
		case x86Argument::argReg:
			switch(inst.argB.type)
			{
			case x86Argument::argNone:
				EMIT_OP_REG(codeGenCtx->ctx, inst.name, inst.argA.reg);
				break;
			case x86Argument::argNumber:
				EMIT_OP_REG_NUM(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.num);
				break;
			case x86Argument::argReg:
				EMIT_OP_REG_REG(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.reg);
				break;
			case x86Argument::argPtr:
				EMIT_OP_REG_RPTR(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.ptrSize, inst.argB.ptrIndex, inst.argB.ptrMult, inst.argB.ptrBase, inst.argB.ptrNum);
				break;
			case x86Argument::argImm64:
				EMIT_OP_REG_NUM64(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.imm64Arg);
				break;
			case x86Argument::argXmmReg:
				EMIT_OP_REG_REG(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.xmmArg);
				break;
			default:
				assert(!"unknown type");
				break;
			}
			break;
		case x86Argument::argPtr:
			switch(inst.argB.type)
			{
			case x86Argument::argNone:
				EMIT_OP_RPTR(codeGenCtx->ctx, inst.name, inst.argA.ptrSize, inst.argA.ptrIndex, inst.argA.ptrMult, inst.argA.ptrBase, inst.argA.ptrNum);
				break;
			case x86Argument::argNumber:
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, inst.name, inst.argA.ptrSize, inst.argA.ptrIndex, inst.argA.ptrMult, inst.argA.ptrBase, inst.argA.ptrNum, inst.argB.num);
				break;
			case x86Argument::argReg:
				EMIT_OP_RPTR_REG(codeGenCtx->ctx, inst.name, inst.argA.ptrSize, inst.argA.ptrIndex, inst.argA.ptrMult, inst.argA.ptrBase, inst.argA.ptrNum, inst.argB.reg);
				break;
			case x86Argument::argXmmReg:
				EMIT_OP_RPTR_REG(codeGenCtx->ctx, inst.name, inst.argA.ptrSize, inst.argA.ptrIndex, inst.argA.ptrMult, inst.argA.ptrBase, inst.argA.ptrNum, inst.argB.xmmArg);
				break;
			default:
				assert(!"unknown type");
				break;
			}
			break;
		case x86Argument::argXmmReg:
			switch(inst.argB.type)
			{
			case x86Argument::argXmmReg:
				EMIT_OP_REG_REG(codeGenCtx->ctx, inst.name, inst.argA.xmmArg, inst.argB.xmmArg);
				break;
			case x86Argument::argPtr:
				EMIT_OP_REG_RPTR(codeGenCtx->ctx, inst.name, inst.argA.xmmArg, inst.argB.ptrSize, inst.argB.ptrIndex, inst.argB.ptrMult, inst.argB.ptrBase, inst.argB.ptrNum);
				break;
			default:
				assert(!"unknown type");
				break;
			}
			break;
		default:
			assert(!"unknown type");
			break;
		}

		SetOptimizationLookBehind(codeGenCtx->ctx, true);
	}

	unsigned int currSize = (int)(codeGenCtx->ctx.GetLastInstruction() - &instList[0]);
	for(unsigned int i = currSize; i < instList.size(); i++)
	{
		instList[i].name = o_other;
		instList[i].instID = 0;
	}

	if(enableLogFiles)
	{
		assert(!output.stream);
		output.stream = output.openStream("asmX86_opt.txt");

		if(output.stream)
		{
			SaveListing(output);

			output.closeStream(output.stream);
			output.stream = NULL;
		}
	}
#endif

	codeJumpTargets.pop_back();

	bool codeRelocated = false;

	if((binCodeSize + instList.size() * 8) > binCodeReserved)
	{
		unsigned int oldBinCodeReserved = binCodeReserved;
		binCodeReserved = binCodeSize + (instList.size()) * 8 + 4096;	// Average instruction size is 8 bytes.
		unsigned char *binCodeNew = (unsigned char*)NULLC::alloc(binCodeReserved);

		// Disable execution of old code body and enable execution of new code body
#ifndef __linux
		DWORD unusedProtect;
		if(binCode && !codeRunning)
			VirtualProtect((void*)binCode, oldBinCodeReserved, oldCodeBodyProtect, (DWORD*)&unusedProtect);
		VirtualProtect((void*)binCodeNew, binCodeReserved, PAGE_EXECUTE_READWRITE, (DWORD*)&oldCodeBodyProtect);
#else
		if(binCode && !codeRunning)
			NULLC::MemProtect((void*)binCode, oldBinCodeReserved, PROT_READ | PROT_WRITE);
		NULLC::MemProtect((void*)binCodeNew, binCodeReserved, PROT_READ | PROT_WRITE | PROT_EXEC);
#endif

		if(binCodeSize)
			NULLC::copyMemory(binCodeNew, binCode, binCodeSize);

		// If code is currently running, update all instruction pointers
		if(codeRunning)
		{
			codeRelocated = true;

			ExpiredCodeBlock block;

			block.code = binCode;
			block.codeSize = oldBinCodeReserved;

#ifdef _M_X64
			block.unwindTable = functionWin64UnwindTable.data;

			functionWin64UnwindTable.data = NULL;
			functionWin64UnwindTable.count = 0;
			functionWin64UnwindTable.max = 0;
#endif

			expiredCodeBlocks.push_back(block);
		}
		else
		{
			NULLC::dealloc(binCode);
		}

		for(unsigned i = 0; i < instAddress.size(); i++)
			instAddress[i] = (instAddress[i] - binCode) + binCodeNew;

		for(unsigned i = 0; i < functionAddress.size(); i++)
		{
			if(functionAddress[i])
				functionAddress[i] = uintptr_t(functionAddress[i] - binCode) + binCodeNew;
		}

		for(unsigned i = 0; i < expiredFunctionAddressLists.size(); i++)
		{
			ExpiredFunctionAddressList &info = expiredFunctionAddressLists[i];

			for(unsigned k = 0; k < info.count; k++)
			{
				if(info.data[k])
					info.data[k] = uintptr_t(info.data[k] - binCode) + binCodeNew;
			}
		}

		binCode = binCodeNew;
	}

	// Translate to x86
	unsigned char *code = binCode + binCodeSize;

	// Linking in new code, destroy final global return code sequence
	if(binCodeSize != 0)
	{
#if defined(_M_X64)
		code -= 10; // xor eax, eax; add rsp, 40; pop r15; pop rbx; ret;
#else
		code -= 8; // xor eax, eax; mov esp, ebp; pop esi; pop ebx; pop ebp; ret;
#endif
	}

	instAddress.resize(exRegVmCode.size() + 1); // Extra instruction for global return
	NULLC::fillMemory(instAddress.data + lastInstructionCount, 0, (exRegVmCode.size() - lastInstructionCount + 1) * sizeof(instAddress[0]));

	vmState.instAddress = instAddress.data;

	x86ClearLabels();
	x86ReserveLabels(codeGenCtx->labelCount);

	code = x86TranslateInstructionList(code, binCode + binCodeReserved, instList.data, instList.size(), instAddress.data);

	assert(binCodeSize < binCodeReserved);

	binCodeSize = unsigned(code - binCode);

#ifndef __linux

#if defined(_M_X64)
	// Create function table for unwind information
	if(!functionWin64UnwindTable.empty())
		RtlDeleteFunctionTable(functionWin64UnwindTable.data);

	functionWin64UnwindTable.clear();

	// Align data block
	code += 16 - unsigned(uintptr_t(code) % 16);

	// Write the unwind data
	assert(sizeof(UNWIND_CODE) == 2);
	assert(sizeof(UNWIND_INFO_FUNCTION) == 4 + 4 * 2);

	UNWIND_INFO_FUNCTION unwindInfo = { 0 };

	unwindInfo.version = 1;
	unwindInfo.flags = 0; // No EH
	unwindInfo.sizeOfProlog = 7;
	unwindInfo.countOfCodes = 3;
	unwindInfo.frameRegister = 0;
	unwindInfo.frameOffset = 0;

	unwindInfo.unwindCode[0].offsetInPrologue = 7;
	unwindInfo.unwindCode[0].operationCode = UWOP_ALLOC_SMALL;
	unwindInfo.unwindCode[0].operationInfo = (40 - 8) / 8;

	unwindInfo.unwindCode[1].offsetInPrologue = 3;
	unwindInfo.unwindCode[1].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[1].operationInfo = 15; // r15

	unwindInfo.unwindCode[2].offsetInPrologue = 1;
	unwindInfo.unwindCode[2].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[2].operationInfo = UWOP_REGISTER_RBX;

	unsigned char *unwindPos = code;

	NULLC::copyMemory(code, &unwindInfo, sizeof(unwindInfo));
	code += sizeof(unwindInfo);

	assert(code < binCode + binCodeReserved);

	for(unsigned i = 0, e = exLinker->exFunctions.size(); i != e; i++)
	{
		ExternFuncInfo &funcInfo = exLinker->exFunctions[i];

		if(funcInfo.regVmAddress != ~0u)
		{
			unsigned char *codeStart = instAddress[funcInfo.regVmAddress];
			unsigned char *codeEnd = instAddress[funcInfo.regVmAddress + funcInfo.regVmCodeSize];

			// Store function info
			RUNTIME_FUNCTION rtFunc;

			rtFunc.BeginAddress = unsigned(codeStart - binCode);
			rtFunc.EndAddress = unsigned(codeEnd - binCode);
			rtFunc.UnwindData = unsigned(unwindPos - binCode);

			functionWin64UnwindTable.push_back(rtFunc);
		}
	}

	for(unsigned i = 0, e = globalCodeRanges.size(); i != e; i += 2)
	{
		unsigned char *codeStart = instAddress[globalCodeRanges[i]];
		unsigned char *codeEnd = instAddress[globalCodeRanges[i + 1]] + unwindInfo.sizeOfProlog; // Add prologue

		// Store function info
		RUNTIME_FUNCTION rtFunc;

		rtFunc.BeginAddress = unsigned(codeStart - binCode);
		rtFunc.EndAddress = unsigned(codeEnd - binCode);
		rtFunc.UnwindData = unsigned(unwindPos - binCode);

		functionWin64UnwindTable.push_back(rtFunc);
	}

	if(!RtlAddFunctionTable(functionWin64UnwindTable.data, functionWin64UnwindTable.size(), uintptr_t(binCode)))
		assert(!"failed to install function table");
#endif

#endif

	assert(unsigned(code - binCode) < binCodeReserved);

	x86SatisfyJumps(instAddress);

	for(unsigned int i = (codeRelocated ? 0 : oldFunctionSize); i < exFunctions.size(); i++)
	{
		if(exFunctions[i].regVmAddress != -1)
			functionAddress[i] = instAddress[exFunctions[i].regVmAddress];
		else
			functionAddress[i] = 0;
	}

	lastInstructionCount = exRegVmCode.size();

	oldJumpTargetCount = exLinker->regVmJumpTargets.size();
	oldRegKillInfoCount = exRegVmRegKillInfo.size();
	oldFunctionSize = exFunctions.size();

	return true;
}